

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void discardBlockComment(void)

{
  LexerState *pLVar1;
  int iVar2;
  
  pLVar1 = lexerState;
  pLVar1->disableMacroArgs = true;
  pLVar1->disableInterpolation = true;
  iVar2 = peek();
  do {
    if (iVar2 == -1) {
      error("Unterminated block comment\n");
LAB_0010e4dc:
      pLVar1 = lexerState;
      pLVar1->disableMacroArgs = false;
      pLVar1->disableInterpolation = false;
      return;
    }
    shiftChar();
    if (iVar2 < 0x2a) {
      if (iVar2 != 10) {
        if (iVar2 != 0xd) goto LAB_0010e4c2;
        iVar2 = peek();
        if (iVar2 == 10) {
          shiftChar();
        }
      }
      pLVar1 = lexerState;
      if (lexerState->expansions == (Expansion *)0x0) {
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar1->colNo = 1;
      }
    }
    else if (iVar2 == 0x2a) {
      iVar2 = peek();
      if (iVar2 == 0x2f) {
        shiftChar();
        goto LAB_0010e4dc;
      }
    }
    else if ((iVar2 == 0x2f) && (iVar2 = peek(), iVar2 == 0x2a)) {
      warning(WARNING_NESTED_COMMENT,"/* in block comment\n");
    }
LAB_0010e4c2:
    iVar2 = peek();
  } while( true );
}

Assistant:

static void discardBlockComment(void)
{
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;
	for (;;) {
		int c = nextChar();

		switch (c) {
		case EOF:
			error("Unterminated block comment\n");
			goto finish;
		case '\r':
			// Handle CRLF before nextLine() since shiftChar updates colNo
			handleCRLF(c);
			// fallthrough
		case '\n':
			if (!lexerState->expansions)
				nextLine();
			continue;
		case '/':
			if (peek() == '*') {
				warning(WARNING_NESTED_COMMENT,
					"/* in block comment\n");
			}
			continue;
		case '*':
			if (peek() == '/') {
				shiftChar();
				goto finish;
			}
			// fallthrough
		default:
			continue;
		}
	}
finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
}